

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_end
          (JUnitReporter *this,CurrentTestCaseStats *param_2)

{
  vector<doctest::String,_std::allocator<doctest::String>_> *in_RDI;
  vector<doctest::String,_std::allocator<doctest::String>_> *unaff_retaddr;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_00000028;
  JUnitTestCaseData *in_stack_00000030;
  pointer *time;
  JUnitTestCaseData *in_stack_ffffffffffffffc0;
  vector<doctest::String,_std::allocator<doctest::String>_> *this_00;
  vector<doctest::String,_std::allocator<doctest::String>_> local_28;
  
  time = &in_RDI[6].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
          super__Vector_impl_data._M_finish;
  detail::Timer::getElapsedSeconds((Timer *)in_RDI);
  JUnitTestCaseData::addTime(in_stack_ffffffffffffffc0,(double)time);
  this_00 = &local_28;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector(unaff_retaddr,in_RDI);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase(in_stack_00000030,in_stack_00000028);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(this_00);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x11d2fd);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats&) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();
        }